

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_update_raw_mouse_mode(Terminal *term)

{
  byte bVar1;
  
  if (term->xterm_mouse == L'\0') {
    bVar1 = false;
  }
  else {
    bVar1 = term->xterm_mouse_forbidden ^ 1;
  }
  (*term->win->vt->set_raw_mouse_mode)(term->win,(_Bool)bVar1);
  term->win_pointer_shape_pending = true;
  term->win_pointer_shape_raw = (_Bool)bVar1;
  if (term->window_update_pending != false) {
    return;
  }
  term->window_update_pending = true;
  queue_toplevel_callback(term_update_callback,term);
  return;
}

Assistant:

static void term_update_raw_mouse_mode(Terminal *term)
{
    bool want_raw = (term->xterm_mouse != 0 && !term->xterm_mouse_forbidden);
    win_set_raw_mouse_mode(term->win, want_raw);
    term->win_pointer_shape_pending = true;
    term->win_pointer_shape_raw = want_raw;
    term_schedule_update(term);
}